

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_histogram.c
# Opt level: O2

REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,REF_INT nbin,REF_DBL exp)

{
  REF_INT *pRVar1;
  long lVar2;
  REF_STATUS RVar3;
  char *pcVar4;
  long lVar5;
  
  ref_histogram->nbin = nbin;
  ref_histogram->exp = exp;
  free(ref_histogram->bins);
  lVar5 = (long)ref_histogram->nbin;
  if (lVar5 < 0) {
    RVar3 = 1;
    pcVar4 = "malloc ref_histogram->bins of REF_INT negative";
  }
  else {
    pRVar1 = (REF_INT *)malloc(lVar5 * 4);
    ref_histogram->bins = pRVar1;
    if (pRVar1 != (REF_INT *)0x0) {
      for (lVar2 = 0; lVar5 != lVar2; lVar2 = lVar2 + 1) {
        pRVar1[lVar2] = 0;
      }
      return 0;
    }
    RVar3 = 2;
    pcVar4 = "malloc ref_histogram->bins of REF_INT NULL";
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_histogram.c",0x42,
         "ref_histogram_resolution",pcVar4);
  return RVar3;
}

Assistant:

REF_FCN REF_STATUS ref_histogram_resolution(REF_HISTOGRAM ref_histogram,
                                            REF_INT nbin, REF_DBL exp) {
  ref_histogram_nbin(ref_histogram) = nbin;
  ref_histogram_exp(ref_histogram) = exp;

  ref_free(ref_histogram->bins);
  ref_malloc_init(ref_histogram->bins, ref_histogram_nbin(ref_histogram),
                  REF_INT, 0);

  return REF_SUCCESS;
}